

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall Timer::Timer(Timer *this)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_Timer::impl_t_*,_false> _Var2;
  pointer *__ptr;
  int iVar3;
  double dVar4;
  double dVar5;
  double local_30;
  double local_28;
  
  _Var2._M_head_impl = (impl_t *)operator_new(1);
  (this->impl)._M_t.super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>._M_t.
  super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>.
  super__Head_base<0UL,_Timer::impl_t_*,_false>._M_head_impl = _Var2._M_head_impl;
  p_Var1 = &(this->timers)._M_t._M_impl.super__Rb_tree_header;
  iVar3 = 0;
  (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->execlist)._M_t._M_impl.super__Rb_tree_header;
  (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dVar4 = GetTime();
  local_30 = 0.0;
  local_28 = dVar4;
  do {
    do {
      dVar5 = GetTime();
    } while (dVar5 == local_28);
    iVar3 = iVar3 + 1;
    local_30 = local_30 + (dVar5 - local_28);
    local_28 = dVar5;
  } while (iVar3 != 100);
  this->resolution = local_30 / 100.0 - dVar4;
  this->changed = true;
  return;
}

Assistant:

Timer::Timer()
	: impl(new impl_t)
{
#ifdef WIN32
#ifndef TIMER_GETTICKCOUNT
	for (int res = 1; res <= 50; ++res)
	{
		if (timeBeginPeriod(res) == TIMERR_NOERROR)
		{
			rres = res;
			break;
		}
	}
#endif // TIMER_GETTICKCOUNT
#endif // WIN32
	double first = Timer::GetTime();
	double cur;
	double last = first;
	double sum = 0.0;

	for (int i = 0; i < 100; )
	{
		cur = Timer::GetTime();

		if (cur != last)
		{
			sum += cur - last;
			last = cur;
			++i;
		}
	};

	this->resolution = sum / 100.0 - first;

	this->changed = true;
}